

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O1

void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter
               (TPZVec<int> *firstHCurlFunc,TPZVec<int> *conOrders,TPZVec<int> *filteredFuncs)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  MElementType MVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  int iVar24;
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar5 = pztopology::TPZCube::NumSides(2);
  iVar6 = pztopology::TPZCube::NumSides(1);
  uVar12 = 0;
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,0);
  if (0 < (int)uVar5) {
    uVar17 = 0;
    uVar12 = 0;
    do {
      lVar8 = (long)iVar6 + uVar17;
      iVar24 = firstHCurlFunc->fStore[lVar8];
      iVar25 = conOrders->fStore[lVar8];
      MVar7 = pztopology::TPZCube::Type((int)lVar8 + 8);
      if (MVar7 == EQuadrilateral) {
        (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs);
        piVar1 = filteredFuncs->fStore;
        lVar8 = 0;
        iVar10 = 0;
        iVar19 = iVar24;
        do {
          if (0 < iVar25) {
            lVar15 = 0;
            do {
              piVar1[(int)uVar12 + lVar15] = iVar19 + (int)lVar15;
              lVar15 = lVar15 + 1;
            } while (iVar25 != (int)lVar15);
            uVar12 = (ulong)(uint)((int)uVar12 + (int)lVar15);
          }
          iVar10 = iVar10 + 1;
          iVar19 = iVar19 + iVar25;
        } while (iVar10 != 3);
        iVar19 = iVar25 + -1;
        uVar18 = iVar19 * iVar19 * 2;
        if (0 < (int)uVar18) {
          piVar1 = filteredFuncs->fStore;
          uVar9 = 0;
          do {
            if ((uVar9 & 1) != 0) {
              piVar1[(int)uVar12] = iVar24 + iVar25 * 4 + uVar9;
              uVar12 = (ulong)((int)uVar12 + 1);
            }
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        if (1 < iVar25) {
          piVar1 = filteredFuncs->fStore;
          do {
            piVar1[(int)uVar12 + lVar8] = uVar18 + iVar24 + iVar25 * 5 + -1 + (int)lVar8;
            lVar8 = lVar8 + 1;
          } while (iVar19 != (int)lVar8);
          uVar12 = (ulong)(uint)((int)uVar12 + (int)lVar8);
        }
      }
      else {
        if (MVar7 != ETriangle) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "static void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter(const TPZVec<int> &, const TPZVec<int> &, TPZVec<int> &) [TSHAPE = pzshape::TPZShapeCube]"
                     ,0xab);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," error. Not yet implemented",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurlNoGrads.cpp"
                     ,0x138);
        }
        if (1 < iVar25) {
          iVar14 = iVar25 + -1;
          (*filteredFuncs->_vptr_TPZVec[3])
                    (filteredFuncs,(long)(int)(((uint)((iVar25 + 2) * iVar14) >> 1) + (int)uVar12));
          piVar1 = filteredFuncs->fStore;
          iVar19 = iVar24;
          iVar10 = 0;
          do {
            uVar11 = uVar12;
            iVar21 = (int)uVar11;
            lVar8 = 0;
            do {
              piVar1[iVar21 + lVar8] = iVar19 + (int)lVar8;
              lVar8 = lVar8 + 1;
            } while (iVar14 != (int)lVar8);
            iVar19 = iVar19 + iVar14;
            bVar22 = iVar10 == 0;
            uVar12 = (ulong)(uint)(iVar21 + (int)lVar8);
            iVar10 = iVar10 + 1;
          } while (bVar22);
          uVar18 = (iVar25 + -2) * iVar14;
          uVar12 = (uVar11 & 0xffffffff) + lVar8;
          if (0 < (int)uVar18) {
            piVar1 = filteredFuncs->fStore;
            uVar9 = 0;
            do {
              if ((uVar9 & 1) != 0) {
                piVar1[(int)uVar12] = iVar14 * 3 + iVar24 + uVar9;
                uVar12 = (ulong)((int)uVar12 + 1);
              }
              uVar9 = uVar9 + 1;
            } while (uVar18 != uVar9);
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar5);
  }
  iVar24 = conOrders->fStore[(int)(iVar6 + uVar5)];
  iVar6 = firstHCurlFunc->fStore[(int)(iVar6 + uVar5)];
  iVar19 = iVar24 * iVar24;
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs);
  iVar25 = iVar19 * 6;
  if (iVar19 < iVar25) {
    piVar1 = filteredFuncs->fStore;
    lVar8 = 0;
    do {
      piVar1[(int)uVar12 + lVar8] = (int)lVar8 + iVar19 + iVar6;
      lVar8 = lVar8 + 1;
    } while (iVar19 * 5 != (int)lVar8);
    uVar12 = (ulong)(uint)((int)uVar12 + (int)lVar8);
  }
  iVar10 = (int)uVar12;
  iVar21 = iVar24 + -1;
  iVar19 = iVar21 * iVar21 * 3;
  iVar14 = iVar19 * iVar21;
  uVar5 = (iVar24 * 2 + -1) * iVar21;
  if (0 < iVar14) {
    piVar1 = filteredFuncs->fStore;
    uVar17 = 0;
    iVar16 = 2;
    iVar20 = iVar14;
    iVar13 = iVar6 + iVar25;
    do {
      if ((int)(uVar17 / 3) * 3 + iVar16 != 0) {
        piVar1[(int)uVar12] = iVar13;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      iVar10 = (int)uVar12;
      uVar17 = (ulong)((int)uVar17 + 1);
      iVar13 = iVar13 + 1;
      iVar16 = iVar16 + -1;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  if (0 < (int)uVar5) {
    piVar1 = filteredFuncs->fStore;
    lVar8 = 0;
    do {
      piVar1[iVar10 + lVar8] = iVar14 + iVar6 + iVar25 + (int)lVar8;
      lVar8 = lVar8 + 1;
    } while (uVar5 != (uint)lVar8);
    iVar10 = iVar10 + (uint)lVar8;
  }
  auVar4 = _DAT_014f8b30;
  auVar3 = _DAT_014f8350;
  auVar2 = _DAT_014f8340;
  if (0 < (int)uVar5) {
    piVar1 = filteredFuncs->fStore;
    lVar8 = (ulong)uVar5 - 1;
    auVar23._8_4_ = (int)lVar8;
    auVar23._0_8_ = lVar8;
    auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
    iVar6 = (iVar24 * 2 + iVar19 + -1) * iVar21 + iVar6 + iVar25;
    uVar12 = 0;
    auVar23 = auVar23 ^ _DAT_014f8350;
    do {
      iVar25 = (int)uVar12;
      auVar26._8_4_ = iVar25;
      auVar26._0_8_ = uVar12;
      auVar26._12_4_ = (int)(uVar12 >> 0x20);
      auVar27 = (auVar26 | auVar2) ^ auVar3;
      iVar24 = auVar23._4_4_;
      if ((bool)(~(auVar27._4_4_ == iVar24 && auVar23._0_4_ < auVar27._0_4_ ||
                  iVar24 < auVar27._4_4_) & 1)) {
        piVar1[(long)iVar10 + uVar12] = iVar6 + iVar25;
      }
      if ((auVar27._12_4_ != auVar23._12_4_ || auVar27._8_4_ <= auVar23._8_4_) &&
          auVar27._12_4_ <= auVar23._12_4_) {
        piVar1[(long)iVar10 + uVar12 + 1] = iVar6 + iVar25 + 1;
      }
      auVar26 = (auVar26 | auVar4) ^ auVar3;
      iVar19 = auVar26._4_4_;
      if (iVar19 <= iVar24 && (iVar19 != iVar24 || auVar26._0_4_ <= auVar23._0_4_)) {
        piVar1[(long)iVar10 + uVar12 + 2] = iVar6 + iVar25 + 2;
        piVar1[(long)iVar10 + uVar12 + 3] = iVar6 + iVar25 + 3;
      }
      uVar12 = uVar12 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar12);
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::HighOrderFunctionsFilter(
  const TPZVec<int> &firstHCurlFunc,
  const TPZVec<int> &conOrders,
  TPZVec<int> &filteredFuncs){
  
  constexpr auto dim = TSHAPE::Dimension;
  constexpr auto nNodes = TSHAPE::NCornerNodes;
  constexpr auto nConnects = TSHAPE::NSides - nNodes;
  const auto nFaces = TSHAPE::NumSides(2);
  const auto nEdges = TSHAPE::NumSides(1);

  filteredFuncs.Resize(0);
  /*
    face connects: 
  */
  auto fcount = 0;
  for(auto iface = 0; iface < nFaces; iface++){
    const auto icon = nEdges + iface;
    const auto side = icon + nNodes;
    const auto firstSideShape = firstHCurlFunc[icon];
    const auto order = conOrders[icon];

    switch(TSHAPE::Type(side)){
    case ETriangle:{
      //there are no face functions for k < 2
      if(order < 2) break;
      /**
         we remove one internal function for each h1 face function of order k+1
         since there are (k-1)(k-2)/2 functions per face in a face with order k,
         we remove k(k-1)/2.
         so:
         (k-1)*(k+1)-k*(k-1)/2 = (k-1)(k+2)/2.
      */
      const auto nfacefuncs =  (order - 1) * (order+2) / 2;
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 3(k-1) vfe funcs.
         that means that, at each k, there are 3 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{3};
      for (auto ie = 0; ie < nedges - 1; ie++){
        const int nfuncs = order-1;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /**
         there are already 2(k-1) filtered functions. we discarded (k-1).
         so that means we need more (k-1)(k-2)/2 functions, because
         2(k-1) + (k-1)(k-2)/2 = (k-1)(k+2)/2. 
         That means we can take exactly half of the phi_fi functions. 
         for each k, there are 2(k-2) phi_fi func. so...
      **/
      auto firstVfiK = firstSideShape + 3*(order-1);
      const auto nPhiFi = (order-1)*(order-2);
      for(auto ifunc = 0; ifunc < nPhiFi; ifunc++){
        if(ifunc%2 == 0) continue;//we always skip one of them
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      break;
    }
    case EQuadrilateral:{
      /*
        from the 2k(k+1) functions, we filter out k^2 gradients of h1, thus
        there are k(k+2) remaining functions.
        from the 2k(k-1) phi_Fi functions, we can remove half of them,
        that sums k(k-1). so, we remove aditionally k phi_Fe functions of a given edge.
        k(k-1) + 3k = k(k+2) as we wanted.

        we need to take into account x- and y -dirs
      */
      const auto nfacefuncs =  order * (order+2);
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 4k vfe funcs.
         that means that, at each k, there are 4 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge, which
         is associated with the x direction
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{4};
      for (auto ie = 0; ie < nedges-1; ie++){
        const int nfuncs = order;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /*now we take half of the phi_fi functions.
        there are 2(k-1)(k-1) scalar functions that will be multiplied by
        vectors in both the x and y directions. we will skip all in the x dir.
        and then, 2*(k-1) functions that will be half in x dir and half in y dir.
        we also skip all in the x dir
       */
      auto firstVfiK = firstSideShape + 4*order;
      const auto nPhiFiK = 2*(order-1)*(order-1);
      const auto nPhiFiK1 = (order-1); // we will have nPhiFiK1 in x and nPhiFiK1 in y
      for(auto ifunc = 0; ifunc < nPhiFiK; ifunc++){
        if(ifunc%2==0) continue;//we always skip the one in x dir
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      //taking only the ones in the y-dir
      for(auto ifunc = 0; ifunc < nPhiFiK1; ifunc++){
        filteredFuncs[fcount] = firstVfiK+nPhiFiK+nPhiFiK1+ifunc;
        fcount++;
      }
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      break;
    }
    default:
      PZError<<__PRETTY_FUNCTION__<<" error. Not yet implemented"<<std::endl;
      DebugStop();
    }

  }
  
  if constexpr (dim < 3) return;

  if constexpr (TSHAPE::Type() == ETetraedro){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)(k-2)(k-3)/6 functions in a h1 element with order k,
       we remove k(k-1)(k-2)/6.
       so:
       (k-1)(k-2)(k+1)/2 - k(k-1)(k-2)/6 = (k-1)(k-2)(2k+3)/6.

       since we will remove k(k-1)(k-2)/6, for each  k   we remove (k-1)(k-2)/2 funcs.

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   k-1                 new funcs
       phi_kf      2(k-1)(k-2)         2(k-2)(k-3)         4(k-2)
       phi_ki      (k-1)(k-2)(k-3)/2   (k-2)(k-3)(k-4)/2   3(k-2)(k-3)/2
            
       that means that if we remove, for each k, (k-2) phi_kf 
       (for instance, all phi_kf associated with a given face),
       we need to remove (k-1)(k-2)/2 - (k-2) = (k-2)(k-3)/2
       which is exactly one third of the phi_ki.
            
    */

    const auto nintfuncs =  (order - 1) * (order-2) * (2*order+ 3) / 6;

    filteredFuncs.Resize(fcount+nintfuncs);

    /**
       we will iterate over the phi_kf hcurl functions.
       we chose to remove all the functions for a given face
       since they are sorted by face, we can simply skip (k-1)(k-2)/2 functions...
    */
    const auto firstvkf = firstSideShape;
    const auto offset = (order-1)*(order-2)/2;
    const auto nvkf = 2*(order-1)*(order-2);
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions
    */

    auto firstVki = firstSideShape + nvkf;
    for(auto ik = 4; ik <= order; ik++){
      //we chose to remove all the functions for a given direction
      const auto newvki = 3*(ik-2)*(ik-3)/2;
      for(auto ifunc = 0; ifunc < newvki; ifunc++){
        if(ifunc%3 == 0) continue;
        filteredFuncs[fcount] = firstVki+ifunc;
        fcount++;
      }
      //we skip to the higher order ones
      firstVki += newvki;
    }
  }
  else if constexpr (TSHAPE::Type() == ECube){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)^3 functions in a h1 element with order k,
       we remove k^3
       so:
       3k^2(k+1) - k^3 = k^2(2k+3)

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   
       phi_kf      6k^2
       phi_ki      3k^2(k-1)

       if we remove all phi_kf associated with a given face (k^2 funcs)
       and all phi_ki associated with a given direction (k^2(k-1)),
       we have removed all k^3 functions that we needed to.
    */

    const auto nintfuncs =  order*order*(2*order+3);

    filteredFuncs.Resize(fcount+nintfuncs);


    const auto firstvkf = firstSideShape;
    
    const auto offset = order*order;//we skip the first face, z direction
    const auto nvkf = 6*order*order;
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions. we have them separated:
       3(k-1)^3 functions of order k and 3(k-1)(2k-1) ( (k-1)(2k-1) in each direction).
       we will filter all funcs in z direction
    */

    const auto firstVki = firstSideShape + nvkf;
    const auto nvkik = 3*(order-1)*(order-1)*(order-1);
    const auto nvkik1 = (order-1)*(2*order-1);//for each direction
    
    for(auto ifunc = 0; ifunc < nvkik; ifunc++){
      if(ifunc%3 == 2) continue;//skip z direction
      filteredFuncs[fcount] = firstVki+ifunc;
      fcount++;
    }

    const auto firstxfunc = firstVki+nvkik;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//x dir
      filteredFuncs[fcount] = firstxfunc+ifunc;
      fcount++;
    }
    const auto firstyfunc = firstxfunc+nvkik1;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//y dir
      filteredFuncs[fcount] = firstyfunc+ifunc;
      fcount++;
    }
  }
}